

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O2

bool __thiscall
CoinStatsIndex::CustomRewind(CoinStatsIndex *this,BlockKey *current_tip,BlockKey *new_tip)

{
  DataStream *this_00;
  uint8_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  __uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true> this_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key_00;
  CBlockIndex *index;
  CBlockIndex *pCVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  Span<const_std::byte> key_01;
  Span<const_std::byte> SVar6;
  char (*in_stack_fffffffffffffe48) [27];
  CoinStatsIndex *this_02;
  undefined4 in_stack_fffffffffffffe58;
  int iVar7;
  string *args_3;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> db_it;
  CDBBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  DBHeightKey key;
  pair<uint256,_(anonymous_namespace)::DBVal>_conflict value;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CDBBatch::CDBBatch(&batch,&((this->m_db)._M_t.
                              super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>
                              .super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->
                             super_CDBWrapper);
  this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>)
       CDBWrapper::NewIterator
                 (&((this->m_db)._M_t.
                    super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>._M_t.
                    super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                    super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper);
  uVar3 = new_tip->height;
  iVar7 = current_tip->height;
  value.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  value.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  db_it._M_t.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
  super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       (__uniq_ptr_data<CDBIterator,_std::default_delete<CDBIterator>,_true,_true>)
       this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl;
  key.height = uVar3;
  DataStream::reserve((DataStream *)&value,0x40);
  DataStream::operator<<((DataStream *)&value,&key);
  SVar6.m_data = (byte *)(value.first.super_base_blob<256U>.m_data._M_elems._0_8_ +
                         value.first.super_base_blob<256U>.m_data._M_elems._24_8_);
  SVar6.m_size = value.first.super_base_blob<256U>.m_data._M_elems._8_8_ - (long)SVar6.m_data;
  CDBIterator::SeekImpl
            ((CDBIterator *)
             this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
             super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
             super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,SVar6);
  args_3 = &(this->super_BaseIndex).m_name;
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&value);
  this_00 = &batch.ssValue;
  while (criticalblock10.super_unique_lock._M_device._0_4_ = uVar3, (int)uVar3 <= iVar7) {
    SVar6 = CDBIterator::GetKeyImpl
                      ((CDBIterator *)
                       this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    DataStream::DataStream((DataStream *)&value,SVar6);
    uVar1 = ser_readdata8<DataStream>((DataStream *)&value);
    if (uVar1 != 't') {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      local_58._M_string_length = std::iostream_category();
      local_58._M_dataplus._M_p._0_4_ = 1;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"Invalid format for coinstatsindex DB height key");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_003e2a31;
    }
    uVar3 = ser_readdata32be<DataStream>((DataStream *)&value);
    key.height = uVar3;
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&value);
    if (uVar3 != (uint32_t)criticalblock10.super_unique_lock._M_device) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
      ;
      source_file_00._M_len = 0x61;
      logging_function_00._M_str = "CopyHeightIndexToHashIndex";
      logging_function_00._M_len = 0x1a;
      LogPrintf_<char[27],std::__cxx11::string,unsigned_char,int>
                (logging_function_00,source_file_00,0xfa,
                 I2P|VALIDATION|QT|COINDB|LIBEVENT|RAND|CMPCTBLOCK|SELECTCOINS|ESTIMATEFEE|ZMQ|TOR|
                 NET,(Level)args_3,(char *)&criticalblock10,in_stack_fffffffffffffe48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (uchar *)CONCAT44(iVar7,in_stack_fffffffffffffe58),(int *)args_3);
      goto LAB_003e2950;
    }
    memset(&value,0,0xa0);
    SVar6 = CDBIterator::GetValueImpl
                      ((CDBIterator *)
                       this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                       super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    DataStream::DataStream((DataStream *)&local_58,SVar6);
    key_00 = dbwrapper_private::GetObfuscateKey
                       (*(CDBWrapper **)
                         this_01.
                         super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>._M_t.
                         super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                         super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    DataStream::Xor((DataStream *)&local_58,key_00);
    DataStream::operator>>((DataStream *)&local_58,&value);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_58);
    local_58.field_2._M_local_buf[0] = value.first.super_base_blob<256U>.m_data._M_elems[0x10];
    local_58.field_2._M_local_buf[1] = value.first.super_base_blob<256U>.m_data._M_elems[0x11];
    local_58.field_2._M_local_buf[2] = value.first.super_base_blob<256U>.m_data._M_elems[0x12];
    local_58.field_2._M_local_buf[3] = value.first.super_base_blob<256U>.m_data._M_elems[0x13];
    local_58.field_2._M_local_buf[4] = value.first.super_base_blob<256U>.m_data._M_elems[0x14];
    local_58.field_2._M_local_buf[5] = value.first.super_base_blob<256U>.m_data._M_elems[0x15];
    local_58.field_2._M_local_buf[6] = value.first.super_base_blob<256U>.m_data._M_elems[0x16];
    local_58.field_2._M_local_buf[7] = value.first.super_base_blob<256U>.m_data._M_elems[0x17];
    local_58.field_2._M_local_buf[8] = value.first.super_base_blob<256U>.m_data._M_elems[0x18];
    local_58.field_2._M_local_buf[9] = value.first.super_base_blob<256U>.m_data._M_elems[0x19];
    local_58.field_2._M_local_buf[10] = value.first.super_base_blob<256U>.m_data._M_elems[0x1a];
    local_58.field_2._M_local_buf[0xb] = value.first.super_base_blob<256U>.m_data._M_elems[0x1b];
    local_58.field_2._M_local_buf[0xc] = value.first.super_base_blob<256U>.m_data._M_elems[0x1c];
    local_58.field_2._M_local_buf[0xd] = value.first.super_base_blob<256U>.m_data._M_elems[0x1d];
    local_58.field_2._M_local_buf[0xe] = value.first.super_base_blob<256U>.m_data._M_elems[0x1e];
    local_58.field_2._M_local_buf[0xf] = value.first.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_58._M_dataplus._M_p = (pointer)value.first.super_base_blob<256U>.m_data._M_elems._0_8_;
    local_58._M_string_length._0_1_ = value.first.super_base_blob<256U>.m_data._M_elems[8];
    local_58._M_string_length._1_1_ = value.first.super_base_blob<256U>.m_data._M_elems[9];
    local_58._M_string_length._2_1_ = value.first.super_base_blob<256U>.m_data._M_elems[10];
    local_58._M_string_length._3_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xb];
    local_58._M_string_length._4_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xc];
    local_58._M_string_length._5_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xd];
    local_58._M_string_length._6_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xe];
    local_58._M_string_length._7_1_ = value.first.super_base_blob<256U>.m_data._M_elems[0xf];
    DataStream::reserve(&batch.ssKey,0x40);
    DataStream::reserve(this_00,0x400);
    DataStream::operator<<(&batch.ssKey,(DBHashKey *)&local_58);
    Serialize<DataStream,_(anonymous_namespace)::DBVal>(this_00,&value.second);
    key_01.m_data =
         batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
         _M_impl.super__Vector_impl_data._M_start + batch.ssKey.m_read_pos;
    key_01.m_size =
         (long)batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)key_01.m_data;
    CDBBatch::WriteImpl(&batch,key_01,this_00);
    if (batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
        .super__Vector_impl_data._M_start) {
      batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           batch.ssKey.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    batch.ssKey.m_read_pos = 0;
    if (batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
      .super__Vector_impl_data._M_finish =
           batch.ssValue.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    batch.ssValue.m_read_pos = 0;
    CDBIterator::Next((CDBIterator *)
                      this_01.super___uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_>.
                      _M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
                      super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
    uVar3 = (uint32_t)criticalblock10.super_unique_lock._M_device + 1;
  }
  bVar2 = CDBWrapper::WriteBatch
                    (&((this->m_db)._M_t.
                       super___uniq_ptr_impl<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_BaseIndex::DB_*,_std::default_delete<BaseIndex::DB>_>.
                       super__Head_base<0UL,_BaseIndex::DB_*,_false>._M_head_impl)->super_CDBWrapper
                     ,&batch,false);
  if (bVar2) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock10,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
               ,0x11b,false);
    this_02 = this;
    index = ::node::BlockManager::LookupBlockIndex
                      (((this->super_BaseIndex).m_chainstate)->m_blockman,&current_tip->hash);
    pCVar4 = ::node::BlockManager::LookupBlockIndex
                       (((this->super_BaseIndex).m_chainstate)->m_blockman,&new_tip->hash);
    do {
      CBlock::CBlock((CBlock *)&value);
      bVar2 = ::node::BlockManager::ReadBlockFromDisk
                        (((this_02->super_BaseIndex).m_chainstate)->m_blockman,(CBlock *)&value,
                         index);
      if (bVar2) {
        bVar2 = ReverseBlock(this_02,(CBlock *)&value,index);
        if (!bVar2) goto LAB_003e27a6;
        index = CBlockIndex::GetAncestor(index,index->nHeight + -1);
        bVar2 = true;
      }
      else {
        CBlockIndex::GetBlockHash((uint256 *)&key,index);
        base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)&key);
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/index/coinstatsindex.cpp"
        ;
        source_file._M_len = 0x61;
        logging_function._M_str = "CustomRewind";
        logging_function._M_len = 0xc;
        LogPrintf_<char[13],std::__cxx11::string>
                  (logging_function,source_file,0x124,
                   I2P|VALIDATION|QT|COINDB|LIBEVENT|RAND|CMPCTBLOCK|SELECTCOINS|ADDRMAN|ESTIMATEFEE
                   |RPC|ZMQ|HTTP|NET,0x6e34b9,(char *)&local_58,
                   (char (*) [13])in_stack_fffffffffffffe48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
        std::__cxx11::string::~string((string *)&local_58);
LAB_003e27a6:
        bVar2 = false;
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)&value.second.total_amount);
    } while ((bVar2 != false) && (pCVar4 != index));
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
  }
  else {
LAB_003e2950:
    bVar2 = false;
  }
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(&db_it);
  CDBBatch::~CDBBatch(&batch);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
LAB_003e2a31:
  __stack_chk_fail();
}

Assistant:

bool CoinStatsIndex::CustomRewind(const interfaces::BlockKey& current_tip, const interfaces::BlockKey& new_tip)
{
    CDBBatch batch(*m_db);
    std::unique_ptr<CDBIterator> db_it(m_db->NewIterator());

    // During a reorg, we need to copy all hash digests for blocks that are
    // getting disconnected from the height index to the hash index so we can
    // still find them when the height index entries are overwritten.
    if (!CopyHeightIndexToHashIndex(*db_it, batch, m_name, new_tip.height, current_tip.height)) {
        return false;
    }

    if (!m_db->WriteBatch(batch)) return false;

    {
        LOCK(cs_main);
        const CBlockIndex* iter_tip{m_chainstate->m_blockman.LookupBlockIndex(current_tip.hash)};
        const CBlockIndex* new_tip_index{m_chainstate->m_blockman.LookupBlockIndex(new_tip.hash)};

        do {
            CBlock block;

            if (!m_chainstate->m_blockman.ReadBlockFromDisk(block, *iter_tip)) {
                LogError("%s: Failed to read block %s from disk\n",
                             __func__, iter_tip->GetBlockHash().ToString());
                return false;
            }

            if (!ReverseBlock(block, iter_tip)) {
                return false; // failure cause logged internally
            }

            iter_tip = iter_tip->GetAncestor(iter_tip->nHeight - 1);
        } while (new_tip_index != iter_tip);
    }

    return true;
}